

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O1

bool __thiscall
cmWriteFileCommand::InitialPass
          (cmWriteFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Ios_Openmode _Var7;
  pointer pbVar8;
  mode_t mode;
  string fileName;
  string dir;
  string message;
  string error;
  ofstream file;
  mode_t local_2b4;
  string local_2b0;
  string local_290;
  char *local_270;
  long local_268;
  char local_260;
  undefined7 uStack_25f;
  string local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    local_270 = &local_260;
    local_268 = 0;
    local_260 = '\0';
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    pcVar1 = (pbVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar1,pcVar1 + pbVar8->_M_string_length);
    pbVar8 = pbVar8 + 1;
    if (pbVar8 == (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      _Var7 = _S_out;
    }
    else {
      bVar2 = true;
      do {
        iVar3 = std::__cxx11::string::compare((char *)pbVar8);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_270,(ulong)(pbVar8->_M_dataplus)._M_p);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      _Var7 = _S_app;
      if (bVar2) {
        _Var7 = _S_out;
      }
    }
    bVar2 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,local_2b0._M_dataplus._M_p);
    if (bVar2) {
      cmsys::SystemTools::GetFilenamePath(&local_290,&local_2b0);
      cmsys::SystemTools::MakeDirectory(local_290._M_dataplus._M_p);
      local_2b4 = 0;
      bVar2 = cmsys::SystemTools::GetPermissions(local_2b0._M_dataplus._M_p,&local_2b4);
      if (bVar2) {
        cmsys::SystemTools::SetPermissions(local_2b0._M_dataplus._M_p,local_2b4 | 0x90,false);
      }
      std::ofstream::ofstream(local_230,local_2b0._M_dataplus._M_p,_Var7);
      bVar2 = (abStack_210[*(long *)((long)local_230 + -0x18)] & 5) == 0;
      if (bVar2) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_270,local_268);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::ofstream::close();
        if (local_2b4 != 0) {
          cmsys::SystemTools::SetPermissions(local_2b0._M_dataplus._M_p,local_2b4,false);
        }
      }
      else {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"Internal CMake error when trying to open file: ","");
        std::__cxx11::string::append((char *)&local_250);
        std::__cxx11::string::append((char *)&local_250);
        cmCommand::SetError(&this->super_cmCommand,&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_290,"attempted to write a file: ",&local_2b0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_220._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_220._8_8_ = plVar4[3];
        local_230 = (undefined1  [8])&local_220;
      }
      else {
        local_220._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar4;
      }
      local_228 = plVar4[1];
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
      cmSystemTools::s_FatalErrorOccured = true;
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmWriteFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  std::string fileName = *i;
  bool overwrite = true;
  i++;

  for(;i != args.end(); ++i)
    {
    if ( *i == "APPEND" )
      {
      overwrite = false;
      }
    else
      {
      message += *i;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(fileName.c_str()) )
    {
    std::string e = "attempted to write a file: " + fileName
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir.c_str());

  mode_t mode = 0;

  // Set permissions to writable
  if ( cmSystemTools::GetPermissions(fileName.c_str(), mode) )
    {
    cmSystemTools::SetPermissions(fileName.c_str(),
#if defined( _MSC_VER ) || defined( __MINGW32__ )
      mode | S_IWRITE
#else
      mode | S_IWUSR | S_IWGRP
#endif
    );
    }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                     overwrite?std::ios::out : std::ios::app);
  if ( !file )
    {
    std::string error = "Internal CMake error when trying to open file: ";
    error += fileName.c_str();
    error += " for writing.";
    this->SetError(error);
    return false;
    }
  file << message << std::endl;
  file.close();
  if(mode)
    {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
    }

  return true;
}